

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

RangeUnit<Js::SourceFunctionNode> Js::GetFullRange<Js::SourceFunctionNode>(void)

{
  RangeUnit<Js::SourceFunctionNode> RVar1;
  undefined8 uVar2;
  undefined1 local_18 [8];
  RangeUnit<Js::SourceFunctionNode> unit;
  
  RangeUnit<Js::SourceFunctionNode>::RangeUnit((RangeUnit<Js::SourceFunctionNode> *)local_18);
  RVar1.j.functionId = 0xfffffffd;
  uVar2 = SUB128(ZEXT412(0xffffffff) << 0x40,0);
  RVar1.i.sourceContextId = (int)uVar2;
  RVar1.i.functionId = (int)((ulong)uVar2 >> 0x20);
  RVar1.j.sourceContextId = SUB124(ZEXT412(0xffffffff) << 0x40,8);
  return RVar1;
}

Assistant:

Js::RangeUnit<Js::SourceFunctionNode> GetFullRange()
    {
        RangeUnit<SourceFunctionNode> unit;
        unit.i.sourceContextId = 0;
        unit.j.sourceContextId = UINT_MAX;
        unit.i.functionId = 0;
        unit.j.functionId = (uint)-3;
        return unit;
    }